

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar1;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar5;
  long in_RCX;
  char *__function;
  FieldDescriptor *field;
  cpp *this_00;
  long lVar6;
  long lVar7;
  string local_70;
  string local_50;
  
  if (0 < *(int *)(this->descriptor_ + 0x48)) {
    lVar6 = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_,lVar6);
      if (psVar1->ptr_ == (EnumGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cpp::EnumGenerator]"
        ;
        goto LAB_001962e7;
      }
      EnumGenerator::GenerateMethods(psVar1->ptr_,printer);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(this->descriptor_ + 0x48));
  }
  if (0 < *(int *)(this->descriptor_ + 0x38)) {
    lVar6 = 0;
    do {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar6);
      if (psVar2->ptr_ == (MessageGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
        ;
        goto LAB_001962e7;
      }
      GenerateClassMethods(psVar2->ptr_,printer);
      io::Printer::Print(printer,"\n");
      io::Printer::Print(printer,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print(printer,"\n");
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(this->descriptor_ + 0x38));
  }
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pFVar3 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar4 + 0x30) + lVar6));
      (*pFVar3->_vptr_FieldGenerator[5])(pFVar3,printer);
      lVar7 = lVar7 + 1;
      pDVar4 = this->descriptor_;
      in_RCX = (long)*(int *)(pDVar4 + 0x2c);
      lVar6 = lVar6 + 0x78;
    } while (lVar7 < in_RCX);
  }
  io::Printer::Print(printer,"#ifndef _MSC_VER\n");
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x2c)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      this_00 = (cpp *)(*(long *)(pDVar4 + 0x30) + lVar6);
      ClassName_abi_cxx11_
                (&local_50,
                 *(cpp **)(this_00 +
                          (ulong)*(byte *)(*(long *)(pDVar4 + 0x30) + 0x34 + lVar6) * 8 + 0x38),
                 (Descriptor *)0x0,SUB81(in_RCX,0));
      FieldConstantName_abi_cxx11_(&local_70,this_00,field);
      io::Printer::Print(printer,"const int $classname$::$constant_name$;\n","classname",&local_50,
                         "constant_name",&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
      pDVar4 = this->descriptor_;
      in_RCX = (long)*(int *)(pDVar4 + 0x2c);
      lVar6 = lVar6 + 0x78;
    } while (lVar7 < in_RCX);
  }
  io::Printer::Print(printer,"#endif  // !_MSC_VER\n\n");
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    lVar6 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar6);
      if (psVar5->ptr_ == (ExtensionGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::cpp::ExtensionGenerator]"
        ;
LAB_001962e7:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,__function);
      }
      ExtensionGenerator::GenerateDefinition(psVar5->ptr_,printer);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)(this->descriptor_ + 0x68));
  }
  GenerateStructors(this,printer);
  io::Printer::Print(printer,"\n");
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 2) {
    GenerateClear(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateMergeFromCodedStream(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateSerializeWithCachedSizes(this,printer);
    io::Printer::Print(printer,"\n");
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 1) {
      GenerateSerializeWithCachedSizesToArray(this,printer);
      io::Printer::Print(printer,"\n");
    }
    GenerateByteSize(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateMergeFrom(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateCopyFrom(this,printer);
    io::Printer::Print(printer,"\n");
    GenerateIsInitialized(this,printer);
    io::Printer::Print(printer,"\n");
  }
  GenerateSwap(this,printer);
  io::Printer::Print(printer,"\n");
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    io::Printer::Print(printer,
                       "::std::string $classname$::GetTypeName() const {\n  return \"$type_name$\";\n}\n\n"
                       ,"classname",&this->classname_,"type_name",
                       *(string **)(this->descriptor_ + 8));
  }
  else {
    io::Printer::Print(printer,
                       "::google::protobuf::Metadata $classname$::GetMetadata() const {\n  protobuf_AssignDescriptorsOnce();\n  ::google::protobuf::Metadata metadata;\n  metadata.descriptor = $classname$_descriptor_;\n  metadata.reflection = $classname$_reflection_;\n  return metadata;\n}\n\n"
                       ,"classname",&this->classname_);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateClassMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateClassMethods(printer);
    printer->Print("\n");
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  // Generate non-inline field definitions.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateNonInlineAccessorDefinitions(printer);
  }

  // Generate field number constants.
  printer->Print("#ifndef _MSC_VER\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor *field = descriptor_->field(i);
    printer->Print(
      "const int $classname$::$constant_name$;\n",
      "classname", ClassName(FieldScope(field), false),
      "constant_name", FieldConstantName(field));
  }
  printer->Print(
    "#endif  // !_MSC_VER\n"
    "\n");

  // Define extension identifiers.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  GenerateStructors(printer);
  printer->Print("\n");

  if (HasGeneratedMethods(descriptor_->file())) {
    GenerateClear(printer);
    printer->Print("\n");

    GenerateMergeFromCodedStream(printer);
    printer->Print("\n");

    GenerateSerializeWithCachedSizes(printer);
    printer->Print("\n");

    if (HasFastArraySerialization(descriptor_->file())) {
      GenerateSerializeWithCachedSizesToArray(printer);
      printer->Print("\n");
    }

    GenerateByteSize(printer);
    printer->Print("\n");

    GenerateMergeFrom(printer);
    printer->Print("\n");

    GenerateCopyFrom(printer);
    printer->Print("\n");

    GenerateIsInitialized(printer);
    printer->Print("\n");
  }

  GenerateSwap(printer);
  printer->Print("\n");

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::Metadata $classname$::GetMetadata() const {\n"
      "  protobuf_AssignDescriptorsOnce();\n"
      "  ::google::protobuf::Metadata metadata;\n"
      "  metadata.descriptor = $classname$_descriptor_;\n"
      "  metadata.reflection = $classname$_reflection_;\n"
      "  return metadata;\n"
      "}\n"
      "\n",
      "classname", classname_);
  } else {
    printer->Print(
      "::std::string $classname$::GetTypeName() const {\n"
      "  return \"$type_name$\";\n"
      "}\n"
      "\n",
      "classname", classname_,
      "type_name", descriptor_->full_name());
  }

}